

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O1

void __thiscall
burst::
difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_const_iterator<int>,_std::less<void>_>
::maintain_invariant
          (difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_const_iterator<int>,_std::less<void>_>
           *this)

{
  int *piVar1;
  _Base_ptr p_Var2;
  
  p_Var2 = (this->m_subtrahend_begin)._M_node;
  while ((p_Var2 != (this->m_subtrahend_end)._M_node &&
         (piVar1 = (this->m_minuend_begin)._M_current, piVar1 != (this->m_minuend_end)._M_current)))
  {
    if (*piVar1 < (int)p_Var2[1]._M_color) {
      return;
    }
    if (*piVar1 <= (int)p_Var2[1]._M_color) {
      (this->m_minuend_begin)._M_current = piVar1 + 1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      (this->m_subtrahend_begin)._M_node = p_Var2;
    }
    drop_subtrahend_head(this);
    p_Var2 = (this->m_subtrahend_begin)._M_node;
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            while (m_subtrahend_begin != m_subtrahend_end
                && m_minuend_begin != m_minuend_end
                && not m_compare(*m_minuend_begin, *m_subtrahend_begin))
            {
                if (not m_compare(*m_subtrahend_begin, *m_minuend_begin))
                {
                    ++m_minuend_begin;
                    ++m_subtrahend_begin;
                }
                drop_subtrahend_head();
            }
        }